

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

void __thiscall QCborValue::QCborValue(QCborValue *this,QUuid *uuid)

{
  long lVar1;
  QByteArray *in_RSI;
  QCborValue *in_RDI;
  long in_FS_OFFSET;
  QCborKnownTags in_stack_ffffffffffffff8c;
  QCborValue *in_stack_ffffffffffffff90;
  QCborValue *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QUuid::toRfc4122((QUuid *)in_stack_ffffffffffffff90);
  QCborValue(this_00,in_RSI);
  QCborValue(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,(QCborValue *)0x470063);
  ~QCborValue(in_stack_ffffffffffffff90);
  QByteArray::~QByteArray((QByteArray *)0x470079);
  in_RDI->t = Uuid;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QCborValue::QCborValue(const QUuid &uuid)
    : QCborValue(QCborKnownTags::Uuid, uuid.toRfc4122())
{
    // change our type
    t = Uuid;
}